

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O2

void csp_can_pbuf_free(csp_can_interface_data_t *ifdata,csp_packet_t *buffer,int buf_free,
                      int *task_woken)

{
  csp_packet_t *packet;
  csp_packet_s **ppcVar1;
  csp_packet_t *pcVar2;
  
  ppcVar1 = &ifdata->pbufs;
  pcVar2 = (csp_packet_t *)0x0;
  while (packet = *ppcVar1, packet != (csp_packet_t *)0x0) {
    if (packet == buffer) {
      ppcVar1 = &pcVar2->next;
      if (pcVar2 == (csp_packet_t *)0x0) {
        ppcVar1 = &ifdata->pbufs;
      }
      *ppcVar1 = packet->next;
      if (buf_free != 0) {
        if (task_woken == (int *)0x0) {
          csp_buffer_free(packet);
        }
        else {
          csp_buffer_free_isr(packet);
        }
      }
    }
    pcVar2 = packet;
    ppcVar1 = &packet->next;
  }
  return;
}

Assistant:

void csp_can_pbuf_free(csp_can_interface_data_t * ifdata, csp_packet_t * buffer, int buf_free, int * task_woken) {

	csp_packet_t * packet = ifdata->pbufs;
	csp_packet_t * prev = NULL;

	while (packet) {

		/* Perform cleanup in used pbufs */
		if (packet == buffer) {

			/* Erase from list prev->next = next */
			if (prev) {
				prev->next = packet->next;
			} else {
				ifdata->pbufs = packet->next;
			}

			if (buf_free) {
				if (task_woken == NULL) {
					csp_buffer_free(packet);
				} else {
					csp_buffer_free_isr(packet);
				}
			}

		}

		prev = packet;
		packet = packet->next;
	}

}